

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestValueTestnonIntegers::runTestCase(TestValueTestnonIntegers *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Id IVar4;
  TestResult *pTVar5;
  double dVar6;
  bool bVar7;
  ValueType VVar8;
  Int IVar9;
  UInt UVar10;
  LargestInt LVar11;
  LargestUInt LVar12;
  float fVar13;
  Value val;
  Value local_2e0;
  undefined1 local_2b8 [24];
  char *local_2a0;
  PredicateContext *local_298;
  Failure *pFStack_290;
  string local_288;
  string local_268;
  IsCheck local_248;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(&local_2e0,nullValue);
  Json::Value::Value(&local_58,1.5);
  Json::Value::operator=(&local_2e0,&local_58);
  Json::Value::~Value(&local_58);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  VVar8 = Json::Value::type(&local_2e0);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar5,realValue,VVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x47d,"Json::realValue == val.type()");
  local_248.isObject_ = false;
  local_248.isArray_ = false;
  local_248.isBool_ = false;
  local_248.isString_ = false;
  local_248.isNull_ = false;
  local_248.isInt_ = false;
  local_248.isInt64_ = false;
  local_248.isUInt_ = false;
  local_248.isUInt64_ = false;
  local_248.isIntegral_ = false;
  local_248.isDouble_ = true;
  local_248.isNumeric_ = true;
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  local_2b8._0_4_ = pTVar5->predicateId_;
  local_2b8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b8._16_4_ = 0x482;
  local_2a0 = "checkIs(val, checks)";
  local_298 = (PredicateContext *)0x0;
  pFStack_290 = (Failure *)0x0;
  pTVar5->predicateStackTail_->next_ = (PredicateContext *)local_2b8;
  pTVar5->predicateId_ = local_2b8._0_4_ + 1;
  pTVar5->predicateStackTail_ = (PredicateContext *)local_2b8;
  ValueTest::checkIs(&this->super_ValueTest,&local_2e0,&local_248);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,intValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x484,"val.isConvertibleTo(Json::intValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,uintValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x485,"val.isConvertibleTo(Json::uintValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,realValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x486,"val.isConvertibleTo(Json::realValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,booleanValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x487,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,stringValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x488,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,nullValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x489,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,arrayValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x48a,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,objectValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x48b,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  dVar6 = Json::Value::asDouble(&local_2e0);
  JsonTest::checkEqual<double,double>
            (pTVar5,1.5,dVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x48d,"1.5 == val.asDouble()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  fVar13 = Json::Value::asFloat(&local_2e0);
  JsonTest::checkEqual<double,float>
            (pTVar5,1.5,fVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x48e,"1.5 == val.asFloat()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  IVar9 = Json::Value::asInt(&local_2e0);
  JsonTest::checkEqual<int,int>
            (pTVar5,1,IVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x48f,"1 == val.asInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar11 = Json::Value::asLargestInt(&local_2e0);
  JsonTest::checkEqual<int,long_long>
            (pTVar5,1,LVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x490,"1 == val.asLargestInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  UVar10 = Json::Value::asUInt(&local_2e0);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar5,1,UVar10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x491,"1 == val.asUInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar12 = Json::Value::asLargestUInt(&local_2e0);
  JsonTest::checkEqual<int,unsigned_long_long>
            (pTVar5,1,LVar12,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x492,"1 == val.asLargestUInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  bVar7 = Json::Value::asBool(&local_2e0);
  JsonTest::checkEqual<bool,bool>
            (pTVar5,true,bVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x493,"true == val.asBool()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_(&local_1b8,&local_2e0);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar5,"1.5",&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x494,"\"1.5\" == val.asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  Json::Value::Value(&local_80,-1.5);
  Json::Value::operator=(&local_2e0,&local_80);
  Json::Value::~Value(&local_80);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  VVar8 = Json::Value::type(&local_2e0);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar5,realValue,VVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x499,"Json::realValue == val.type()");
  local_248.isObject_ = false;
  local_248.isArray_ = false;
  local_248.isBool_ = false;
  local_248.isString_ = false;
  local_248.isNull_ = false;
  local_248.isInt_ = false;
  local_248.isInt64_ = false;
  local_248.isUInt_ = false;
  local_248.isUInt64_ = false;
  local_248.isIntegral_ = false;
  local_248.isDouble_ = true;
  local_248.isNumeric_ = true;
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  IVar4 = pTVar5->predicateId_;
  local_2b8._0_4_ = IVar4;
  local_2b8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b8._16_4_ = 0x49e;
  local_2a0 = "checkIs(val, checks)";
  local_298 = (PredicateContext *)0x0;
  pFStack_290 = (Failure *)0x0;
  pTVar5->predicateStackTail_->next_ = (PredicateContext *)local_2b8;
  pTVar5->predicateId_ = IVar4 + 1;
  pTVar5->predicateStackTail_ = (PredicateContext *)local_2b8;
  ValueTest::checkIs(&this->super_ValueTest,&local_2e0,&local_248);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,intValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a0,"val.isConvertibleTo(Json::intValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,realValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a1,"val.isConvertibleTo(Json::realValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,booleanValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a2,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,stringValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a3,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,nullValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a4,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,uintValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a5,"!val.isConvertibleTo(Json::uintValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,arrayValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a6,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,objectValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a7,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  dVar6 = Json::Value::asDouble(&local_2e0);
  JsonTest::checkEqual<double,double>
            (pTVar5,-1.5,dVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4a9,"-1.5 == val.asDouble()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  fVar13 = Json::Value::asFloat(&local_2e0);
  JsonTest::checkEqual<double,float>
            (pTVar5,-1.5,fVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4aa,"-1.5 == val.asFloat()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  IVar9 = Json::Value::asInt(&local_2e0);
  JsonTest::checkEqual<int,int>
            (pTVar5,-1,IVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ab,"-1 == val.asInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar11 = Json::Value::asLargestInt(&local_2e0);
  JsonTest::checkEqual<int,long_long>
            (pTVar5,-1,LVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ac,"-1 == val.asLargestInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  bVar7 = Json::Value::asBool(&local_2e0);
  JsonTest::checkEqual<bool,bool>
            (pTVar5,true,bVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ad,"true == val.asBool()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_(&local_1d8,&local_2e0);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar5,"-1.5",&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ae,"\"-1.5\" == val.asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  Json::Value::Value(&local_a8,2147483647.5);
  Json::Value::operator=(&local_2e0,&local_a8);
  Json::Value::~Value(&local_a8);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  VVar8 = Json::Value::type(&local_2e0);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar5,realValue,VVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4b3,"Json::realValue == val.type()");
  local_248.isObject_ = false;
  local_248.isArray_ = false;
  local_248.isBool_ = false;
  local_248.isString_ = false;
  local_248.isNull_ = false;
  local_248.isInt_ = false;
  local_248.isInt64_ = false;
  local_248.isUInt_ = false;
  local_248.isUInt64_ = false;
  local_248.isIntegral_ = false;
  local_248.isDouble_ = true;
  local_248.isNumeric_ = true;
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  IVar4 = pTVar5->predicateId_;
  local_2b8._0_4_ = IVar4;
  local_2b8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b8._16_4_ = 0x4b8;
  local_2a0 = "checkIs(val, checks)";
  local_298 = (PredicateContext *)0x0;
  pFStack_290 = (Failure *)0x0;
  pTVar5->predicateStackTail_->next_ = (PredicateContext *)local_2b8;
  pTVar5->predicateId_ = IVar4 + 1;
  pTVar5->predicateStackTail_ = (PredicateContext *)local_2b8;
  ValueTest::checkIs(&this->super_ValueTest,&local_2e0,&local_248);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,uintValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4ba,"val.isConvertibleTo(Json::uintValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,realValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bb,"val.isConvertibleTo(Json::realValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,booleanValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bc,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,stringValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bd,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,nullValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4be,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,intValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bf,"!val.isConvertibleTo(Json::intValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,arrayValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4c0,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,objectValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4c1,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  dVar6 = Json::Value::asDouble(&local_2e0);
  JsonTest::checkEqual<double,double>
            (pTVar5,2147483647.5,dVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c3,"2147483647.5 == val.asDouble()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  fVar13 = Json::Value::asFloat(&local_2e0);
  JsonTest::checkEqual<float,float>
            (pTVar5,2.1474836e+09,fVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c4,"float(2147483647.5) == val.asFloat()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  UVar10 = Json::Value::asUInt(&local_2e0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar5,0x7fffffff,UVar10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c5,"2147483647U == val.asUInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar11 = Json::Value::asLargestInt(&local_2e0);
  JsonTest::checkEqual<long,long_long>
            (pTVar5,0x7fffffff,LVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c7,"2147483647L == val.asLargestInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar12 = Json::Value::asLargestUInt(&local_2e0);
  JsonTest::checkEqual<unsigned_int,unsigned_long_long>
            (pTVar5,0x7fffffff,LVar12,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c8,"2147483647U == val.asLargestUInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  bVar7 = Json::Value::asBool(&local_2e0);
  JsonTest::checkEqual<bool,bool>
            (pTVar5,true,bVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ca,"true == val.asBool()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_((string *)local_2b8,&local_2e0);
  ValueTest::normalizeFloatingPointStr(&local_1f8,(string *)local_2b8);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar5,"2147483647.5",&local_1f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4cc,"\"2147483647.5\" == normalizeFloatingPointStr(val.asString())");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  pcVar1 = local_2b8 + 0x10;
  if ((pointer)local_2b8._0_8_ != pcVar1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Json::Value::Value(&local_d0,-2147483648.5);
  Json::Value::operator=(&local_2e0,&local_d0);
  Json::Value::~Value(&local_d0);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  VVar8 = Json::Value::type(&local_2e0);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar5,realValue,VVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4d1,"Json::realValue == val.type()");
  local_248.isObject_ = false;
  local_248.isArray_ = false;
  local_248.isBool_ = false;
  local_248.isString_ = false;
  local_248.isNull_ = false;
  local_248.isInt_ = false;
  local_248.isInt64_ = false;
  local_248.isUInt_ = false;
  local_248.isUInt64_ = false;
  local_248.isIntegral_ = false;
  local_248.isDouble_ = true;
  local_248.isNumeric_ = true;
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  IVar4 = pTVar5->predicateId_;
  local_2b8._0_4_ = IVar4;
  local_2b8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b8._16_4_ = 0x4d6;
  local_2a0 = "checkIs(val, checks)";
  local_298 = (PredicateContext *)0x0;
  pFStack_290 = (Failure *)0x0;
  pTVar5->predicateStackTail_->next_ = (PredicateContext *)local_2b8;
  pTVar5->predicateId_ = IVar4 + 1;
  pTVar5->predicateStackTail_ = (PredicateContext *)local_2b8;
  ValueTest::checkIs(&this->super_ValueTest,&local_2e0,&local_248);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,realValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4d8,"val.isConvertibleTo(Json::realValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,booleanValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4d9,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,stringValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4da,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,nullValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4db,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,intValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4dc,"!val.isConvertibleTo(Json::intValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,uintValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4dd,"!val.isConvertibleTo(Json::uintValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,arrayValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4de,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,objectValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4df,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  dVar6 = Json::Value::asDouble(&local_2e0);
  JsonTest::checkEqual<double,double>
            (pTVar5,-2147483648.5,dVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e1,"-2147483648.5 == val.asDouble()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  fVar13 = Json::Value::asFloat(&local_2e0);
  JsonTest::checkEqual<float,float>
            (pTVar5,-2.1474836e+09,fVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e2,"float(-2147483648.5) == val.asFloat()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar11 = Json::Value::asLargestInt(&local_2e0);
  JsonTest::checkEqual<long_long,long_long>
            (pTVar5,-0x80000000,LVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e4,"-Json::Int64(1) << 31 == val.asLargestInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  bVar7 = Json::Value::asBool(&local_2e0);
  JsonTest::checkEqual<bool,bool>
            (pTVar5,true,bVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e6,"true == val.asBool()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_((string *)local_2b8,&local_2e0);
  ValueTest::normalizeFloatingPointStr(&local_218,(string *)local_2b8);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar5,"-2147483648.5",&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e8,"\"-2147483648.5\" == normalizeFloatingPointStr(val.asString())");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Json::Value::Value(&local_f8,4294967295.5);
  Json::Value::operator=(&local_2e0,&local_f8);
  Json::Value::~Value(&local_f8);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  VVar8 = Json::Value::type(&local_2e0);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar5,realValue,VVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ed,"Json::realValue == val.type()");
  local_248.isObject_ = false;
  local_248.isArray_ = false;
  local_248.isBool_ = false;
  local_248.isString_ = false;
  local_248.isNull_ = false;
  local_248.isInt_ = false;
  local_248.isInt64_ = false;
  local_248.isUInt_ = false;
  local_248.isUInt64_ = false;
  local_248.isIntegral_ = false;
  local_248.isDouble_ = true;
  local_248.isNumeric_ = true;
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  IVar4 = pTVar5->predicateId_;
  local_2b8._0_4_ = IVar4;
  local_2b8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b8._16_4_ = 0x4f2;
  local_2a0 = "checkIs(val, checks)";
  local_298 = (PredicateContext *)0x0;
  pFStack_290 = (Failure *)0x0;
  pTVar5->predicateStackTail_->next_ = (PredicateContext *)local_2b8;
  pTVar5->predicateId_ = IVar4 + 1;
  pTVar5->predicateStackTail_ = (PredicateContext *)local_2b8;
  ValueTest::checkIs(&this->super_ValueTest,&local_2e0,&local_248);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,realValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f4,"val.isConvertibleTo(Json::realValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,booleanValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f5,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,stringValue);
  if (!bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f6,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,nullValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f7,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,intValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f8,"!val.isConvertibleTo(Json::intValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,uintValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f9,"!val.isConvertibleTo(Json::uintValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,arrayValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4fa,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar7 = Json::Value::isConvertibleTo(&local_2e0,objectValue);
  if (bVar7) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4fb,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  dVar6 = Json::Value::asDouble(&local_2e0);
  JsonTest::checkEqual<double,double>
            (pTVar5,4294967295.5,dVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4fd,"4294967295.5 == val.asDouble()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  fVar13 = Json::Value::asFloat(&local_2e0);
  JsonTest::checkEqual<float,float>
            (pTVar5,4.2949673e+09,fVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4fe,"float(4294967295.5) == val.asFloat()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar11 = Json::Value::asLargestInt(&local_2e0);
  JsonTest::checkEqual<long_long,long_long>
            (pTVar5,0xffffffff,LVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x500,"(Json::Int64(1) << 32) - 1 == val.asLargestInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  LVar12 = Json::Value::asLargestUInt(&local_2e0);
  JsonTest::checkEqual<unsigned_long_long,unsigned_long_long>
            (pTVar5,0xffffffff,LVar12,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x502,"(Json::UInt64(1) << 32) - Json::UInt64(1) == val.asLargestUInt()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  bVar7 = Json::Value::asBool(&local_2e0);
  JsonTest::checkEqual<bool,bool>
            (pTVar5,true,bVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x504,"true == val.asBool()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_((string *)local_2b8,&local_2e0);
  ValueTest::normalizeFloatingPointStr(&local_238,(string *)local_2b8);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar5,"4294967295.5",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x506,"\"4294967295.5\" == normalizeFloatingPointStr(val.asString())");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Json::Value::Value(&local_120,1.2345678901234);
  Json::Value::operator=(&local_2e0,&local_120);
  Json::Value::~Value(&local_120);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  local_2b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"1.2345678901234001","");
  Json::Value::asString_abi_cxx11_(&local_288,&local_2e0);
  ValueTest::normalizeFloatingPointStr(&local_268,&local_288);
  JsonTest::checkStringEqual
            (pTVar5,(string *)local_2b8,&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x50a,"\"1.2345678901234001\" == normalizeFloatingPointStr(val.asString())");
  paVar3 = &local_268.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar3) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  paVar2 = &local_288.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Json::Value::Value(&local_148,2.199023255552e+15);
  Json::Value::operator=(&local_2e0,&local_148);
  Json::Value::~Value(&local_148);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  fVar13 = Json::Value::asFloat(&local_2e0);
  JsonTest::checkEqual<float,float>
            (pTVar5,2.1990233e+15,fVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x50e,"float(2199023255552000) == val.asFloat()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  local_2b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"2199023255552000","");
  Json::Value::asString_abi_cxx11_(&local_288,&local_2e0);
  ValueTest::normalizeFloatingPointStr(&local_268,&local_288);
  JsonTest::checkStringEqual
            (pTVar5,(string *)local_2b8,&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x510,"\"2199023255552000\" == normalizeFloatingPointStr(val.asString())");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar3) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Json::Value::Value(&local_170,3.402823466385289e+38);
  Json::Value::operator=(&local_2e0,&local_170);
  Json::Value::~Value(&local_170);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  fVar13 = Json::Value::asFloat(&local_2e0);
  JsonTest::checkEqual<float,float>
            (pTVar5,3.4028235e+38,fVar13,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x514,"float(3.402823466385289e38) == val.asFloat()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  local_2b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"3.402823466385289e+38","");
  Json::Value::asString_abi_cxx11_(&local_288,&local_2e0);
  ValueTest::normalizeFloatingPointStr(&local_268,&local_288);
  JsonTest::checkStringEqual
            (pTVar5,(string *)local_2b8,&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x516,"\"3.402823466385289e+38\" == normalizeFloatingPointStr(val.asString())");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar3) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Json::Value::Value(&local_198,1.2345678e+300);
  Json::Value::operator=(&local_2e0,&local_198);
  Json::Value::~Value(&local_198);
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  dVar6 = Json::Value::asDouble(&local_2e0);
  JsonTest::checkEqual<double,double>
            (pTVar5,1.2345678e+300,dVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x51a,"double(1.2345678e300) == val.asDouble()");
  pTVar5 = (this->super_ValueTest).super_TestCase.result_;
  local_2b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"1.2345678e+300","");
  Json::Value::asString_abi_cxx11_(&local_288,&local_2e0);
  ValueTest::normalizeFloatingPointStr(&local_268,&local_288);
  JsonTest::checkStringEqual
            (pTVar5,(string *)local_2b8,&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x51c,"\"1.2345678e+300\" == normalizeFloatingPointStr(val.asString())");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar3) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Json::Value::~Value(&local_2e0);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, nonIntegers) {
  IsCheck checks;
  Json::Value val;

  // Small positive number
  val = Json::Value(1.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(1.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(1.5, val.asFloat());
  JSONTEST_ASSERT_EQUAL(1, val.asInt());
  JSONTEST_ASSERT_EQUAL(1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(1, val.asUInt());
  JSONTEST_ASSERT_EQUAL(1, val.asLargestUInt());
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("1.5", val.asString());

  // Small negative number
  val = Json::Value(-1.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(-1.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(-1.5, val.asFloat());
  JSONTEST_ASSERT_EQUAL(-1, val.asInt());
  JSONTEST_ASSERT_EQUAL(-1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("-1.5", val.asString());

  // A bit over int32 max
  val = Json::Value(kint32max + 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(2147483647.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(2147483647.5), val.asFloat());
  JSONTEST_ASSERT_EQUAL(2147483647U, val.asUInt());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(2147483647L, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(2147483647U, val.asLargestUInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("2147483647.5",
                        normalizeFloatingPointStr(val.asString()));

  // A bit under int32 min
  val = Json::Value(kint32min - 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(-2147483648.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(-2147483648.5), val.asFloat());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(-Json::Int64(1) << 31, val.asLargestInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("-2147483648.5",
                        normalizeFloatingPointStr(val.asString()));

  // A bit over uint32 max
  val = Json::Value(kuint32max + 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(4294967295.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(4294967295.5), val.asFloat());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL((Json::Int64(1) << 32) - 1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL((Json::UInt64(1) << 32) - Json::UInt64(1),
                        val.asLargestUInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("4294967295.5",
                        normalizeFloatingPointStr(val.asString()));

  val = Json::Value(1.2345678901234);
  JSONTEST_ASSERT_STRING_EQUAL("1.2345678901234001",
                               normalizeFloatingPointStr(val.asString()));

  // A 16-digit floating point number.
  val = Json::Value(2199023255552000.0f);
  JSONTEST_ASSERT_EQUAL(float(2199023255552000), val.asFloat());
  JSONTEST_ASSERT_STRING_EQUAL("2199023255552000",
                               normalizeFloatingPointStr(val.asString()));

  // A very large floating point number.
  val = Json::Value(3.402823466385289e38);
  JSONTEST_ASSERT_EQUAL(float(3.402823466385289e38), val.asFloat());
  JSONTEST_ASSERT_STRING_EQUAL("3.402823466385289e+38",
                               normalizeFloatingPointStr(val.asString()));

  // An even larger floating point number.
  val = Json::Value(1.2345678e300);
  JSONTEST_ASSERT_EQUAL(double(1.2345678e300), val.asDouble());
  JSONTEST_ASSERT_STRING_EQUAL("1.2345678e+300",
                               normalizeFloatingPointStr(val.asString()));
}